

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall value_int::test_method(value_int *this)

{
  undefined1 uVar1;
  Value value;
  Value value1;
  int aint1;
  output_test_stream output;
  char *local_2f0;
  char *local_2e8;
  shared_count local_2e0;
  Value local_2d8 [16];
  Value local_2c8 [20];
  int local_2b4;
  char *local_2b0;
  char *local_2a8;
  undefined **local_2a0;
  ulong local_298;
  shared_count sStack_290;
  char **local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char **local_198;
  
  local_2b4 = 5;
  dynamicgraph::command::Value::Value(local_2c8,&local_2b4);
  dynamicgraph::command::Value::Value(local_2d8,local_2c8);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0xcf);
  uVar1 = dynamicgraph::command::Value::operator==(local_2c8,local_2d8);
  local_2a0 = (undefined **)CONCAT71(local_2a0._1_7_,uVar1);
  local_298 = 0;
  sStack_290.pi_ = (sp_counted_base *)0x0;
  local_198 = &local_2f0;
  local_2f0 = "value1 == value";
  local_2e8 = "";
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00112c00;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1d8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_290);
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)&local_1b0,&local_1f0,1,1);
  dynamicgraph::command::operator<<((ostream *)&local_1b0,local_2c8);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0xd4);
  local_220 = "Type=int, value=5";
  local_218 = "";
  boost::test_tools::output_test_stream::is_equal(&local_2f0,&local_1b0,&local_220,1);
  local_2b0 = "output.is_equal(\"Type=int, value=5\")";
  local_2a8 = "";
  local_298 = local_298 & 0xffffffffffffff00;
  local_2a0 = &PTR__lazy_ostream_00112c00;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_228 = "";
  local_288 = &local_2b0;
  boost::test_tools::tt_detail::report_assertion(&local_2f0,&local_2a0,&local_230,0xd4,1,0,0);
  boost::detail::shared_count::~shared_count(&local_2e0);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)&local_1b0);
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::test_tools::output_test_stream::output_test_stream
            ((output_test_stream *)&local_1b0,&local_240,1,1);
  dynamicgraph::command::operator<<((ostream *)&local_1b0,local_2d8);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0xda);
  local_270 = "Type=int, value=5";
  local_268 = "";
  boost::test_tools::output_test_stream::is_equal(&local_2f0,&local_1b0,&local_270,1);
  local_2b0 = "output.is_equal(\"Type=int, value=5\")";
  local_2a8 = "";
  local_298 = local_298 & 0xffffffffffffff00;
  local_2a0 = &PTR__lazy_ostream_00112c00;
  sStack_290.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
  ;
  local_278 = "";
  local_288 = &local_2b0;
  boost::test_tools::tt_detail::report_assertion(&local_2f0,&local_2a0,&local_280,0xda,1,0,0);
  boost::detail::shared_count::~shared_count(&local_2e0);
  boost::test_tools::output_test_stream::~output_test_stream((output_test_stream *)&local_1b0);
  dynamicgraph::command::Value::~Value(local_2d8);
  dynamicgraph::command::Value::~Value(local_2c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_int) {
  using dg::command::Value;

  int aint1(5);
  Value value1(aint1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=int, value=5"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=int, value=5"));
  }
}